

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuralnet.cpp
# Opt level: O2

string * __thiscall
indk::NeuralNet::getName_abi_cxx11_(string *__return_storage_ptr__,NeuralNet *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  return __return_storage_ptr__;
}

Assistant:

std::string indk::NeuralNet::getName() {
    return Name;
}